

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O2

bool Js::JavascriptLibrary::InitializeMapConstructor
               (DynamicObject *mapConstructor,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  JavascriptLibrary *this;
  ScriptContext *this_00;
  PropertyString *pPVar1;
  
  DeferredTypeHandlerBase::Convert(typeHandler,mapConstructor,mode,3,0);
  this = (((mapConstructor->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr;
  this_00 = (this->super_JavascriptLibraryBase).scriptContext.ptr;
  (*(mapConstructor->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(mapConstructor,0xd1,0x1000000000000,2,0,0,0);
  (*(mapConstructor->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])
            (mapConstructor,0x124,(this->super_JavascriptLibraryBase).mapPrototype.ptr,0,0,0,0);
  AddSpeciesAccessorsToLibraryObject
            (this,mapConstructor,(FunctionInfo *)JavascriptMap::EntryInfo::GetterSymbolSpecies);
  pPVar1 = ScriptContext::GetPropertyString(this_00,0xd6);
  (*(mapConstructor->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(mapConstructor,0x106,pPVar1,2,0,0,0);
  DynamicObject::SetHasNoEnumerableProperties(mapConstructor,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeMapConstructor(DynamicObject* mapConstructor, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(mapConstructor, mode, 3);
        // Note: Any new function addition/deletion/modification should also be updated in JavascriptLibrary::ProfilerRegisterMap
        // so that the update is in sync with profiler
        JavascriptLibrary* library = mapConstructor->GetLibrary();
        ScriptContext* scriptContext = mapConstructor->GetScriptContext();
        library->AddMember(mapConstructor, PropertyIds::length, TaggedInt::ToVarUnchecked(0), PropertyConfigurable);
        library->AddMember(mapConstructor, PropertyIds::prototype, library->mapPrototype, PropertyNone);
        library->AddSpeciesAccessorsToLibraryObject(mapConstructor, &JavascriptMap::EntryInfo::GetterSymbolSpecies);
        library->AddMember(mapConstructor, PropertyIds::name, scriptContext->GetPropertyString(PropertyIds::Map), PropertyConfigurable);

        mapConstructor->SetHasNoEnumerableProperties(true);

        return true;
    }